

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O3

void test_bson_utf8_from_unichar(void)

{
  char *__s;
  char cVar1;
  size_t sVar2;
  uchar *suite;
  char **ppcVar3;
  uint32_t len;
  char str [6];
  int local_14;
  short local_e;
  char local_c;
  
  bson_utf8_from_unichar(0,&local_e,&local_14);
  if (local_14 == 1) {
    bson_utf8_from_unichar(0x80,&local_e,&local_14);
    if (local_14 != 2) goto LAB_001376dc;
    bson_utf8_from_unichar(0x800,&local_e,&local_14);
    if (local_14 != 3) goto LAB_001376e1;
    bson_utf8_from_unichar(0x10000,&local_e,&local_14);
    if (local_14 != 4) goto LAB_001376e6;
    bson_utf8_from_unichar(0x200000,&local_e,&local_14);
    if (local_14 != 5) goto LAB_001376eb;
    bson_utf8_from_unichar(0x4000000,&local_e,&local_14);
    if (local_14 != 6) goto LAB_001376f0;
    bson_utf8_from_unichar(0x7f,&local_e,&local_14);
    if (local_14 != 1) goto LAB_001376f5;
    bson_utf8_from_unichar(0x7ff,&local_e,&local_14);
    if (local_14 != 2) goto LAB_001376fa;
    bson_utf8_from_unichar(0xffff,&local_e,&local_14);
    if (local_14 != 3) goto LAB_001376ff;
    bson_utf8_from_unichar(0x1fffff,&local_e,&local_14);
    if (local_14 != 4) goto LAB_00137704;
    bson_utf8_from_unichar(0x3ffffff,&local_e,&local_14);
    if (local_14 != 5) goto LAB_00137709;
    bson_utf8_from_unichar(0x7fffffff,&local_e,&local_14);
    if (local_14 != 6) goto LAB_0013770e;
    bson_utf8_from_unichar(0xd7ff,&local_e,&local_14);
    if (local_14 != 3) goto LAB_00137713;
    bson_utf8_from_unichar(0xe000,&local_e,&local_14);
    if (local_14 != 3) goto LAB_00137718;
    bson_utf8_from_unichar(0xfffd,&local_e,&local_14);
    if (local_14 != 3) goto LAB_0013771d;
    bson_utf8_from_unichar(0x10ffff,&local_e,&local_14);
    if (local_14 != 4) goto LAB_00137722;
    bson_utf8_from_unichar(0x110000,&local_e,&local_14);
    if (local_14 != 4) goto LAB_00137727;
    bson_utf8_from_unichar(0x61,&local_e,&local_14);
    if (local_14 != 1) goto LAB_0013772c;
    if ((char)local_e != 'a') goto LAB_00137731;
    bson_utf8_from_unichar(0xff,&local_e,&local_14);
    if (local_14 != 2) goto LAB_00137736;
    if (local_e != -0x403d) goto LAB_0013773b;
    bson_utf8_from_unichar(0x20ac,&local_e,&local_14);
    if (local_14 == 3) {
      if (local_c == -0x54 && local_e == -0x7d1e) {
        return;
      }
      goto LAB_00137745;
    }
  }
  else {
    test_bson_utf8_from_unichar_cold_1();
LAB_001376dc:
    test_bson_utf8_from_unichar_cold_2();
LAB_001376e1:
    test_bson_utf8_from_unichar_cold_3();
LAB_001376e6:
    test_bson_utf8_from_unichar_cold_4();
LAB_001376eb:
    test_bson_utf8_from_unichar_cold_5();
LAB_001376f0:
    test_bson_utf8_from_unichar_cold_6();
LAB_001376f5:
    test_bson_utf8_from_unichar_cold_7();
LAB_001376fa:
    test_bson_utf8_from_unichar_cold_8();
LAB_001376ff:
    test_bson_utf8_from_unichar_cold_9();
LAB_00137704:
    test_bson_utf8_from_unichar_cold_10();
LAB_00137709:
    test_bson_utf8_from_unichar_cold_11();
LAB_0013770e:
    test_bson_utf8_from_unichar_cold_12();
LAB_00137713:
    test_bson_utf8_from_unichar_cold_13();
LAB_00137718:
    test_bson_utf8_from_unichar_cold_14();
LAB_0013771d:
    test_bson_utf8_from_unichar_cold_15();
LAB_00137722:
    test_bson_utf8_from_unichar_cold_16();
LAB_00137727:
    test_bson_utf8_from_unichar_cold_17();
LAB_0013772c:
    test_bson_utf8_from_unichar_cold_18();
LAB_00137731:
    test_bson_utf8_from_unichar_cold_19();
LAB_00137736:
    test_bson_utf8_from_unichar_cold_20();
LAB_0013773b:
    test_bson_utf8_from_unichar_cold_21();
  }
  test_bson_utf8_from_unichar_cold_22();
LAB_00137745:
  test_bson_utf8_from_unichar_cold_23();
  ppcVar3 = test_bson_utf8_non_shortest::tests;
  suite = (uchar *)0x0;
  do {
    __s = *ppcVar3;
    sVar2 = strlen(__s);
    cVar1 = bson_utf8_validate(__s,sVar2,0);
    if (cVar1 != '\0') {
      test_bson_utf8_non_shortest_cold_2();
      goto LAB_001377a9;
    }
    suite = (uchar *)((long)&((TestSuite *)suite)->prgname + 1);
    ppcVar3 = ppcVar3 + 1;
  } while ((TestSuite *)suite != (TestSuite *)0x5);
  suite = test_bson_utf8_validate::test2;
  cVar1 = bson_utf8_validate(test_bson_utf8_validate::test2,2,1);
  if (cVar1 != '\0') {
    return;
  }
LAB_001377a9:
  test_bson_utf8_non_shortest_cold_1();
  TestSuite_Add((TestSuite *)suite,"/bson/value/basic",test_value_basic);
  TestSuite_Add((TestSuite *)suite,"/bson/value/decimal128",test_value_decimal128);
  return;
}

Assistant:

static void
test_bson_utf8_from_unichar (void)
{
   static const char test1[] = {'a'};
   static const unsigned char test2[] = {0xc3, 0xbf};
   static const unsigned char test3[] = {0xe2, 0x82, 0xac};
   uint32_t len;
   char str[6];

   /*
    * First possible sequence of a certain length.
    */
   bson_utf8_from_unichar (0, str, &len);
   BSON_ASSERT (len == 1);
   bson_utf8_from_unichar (0x00000080, str, &len);
   BSON_ASSERT (len == 2);
   bson_utf8_from_unichar (0x00000800, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x00010000, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x00200000, str, &len);
   BSON_ASSERT (len == 5);
   bson_utf8_from_unichar (0x04000000, str, &len);
   BSON_ASSERT (len == 6);

   /*
    * Last possible sequence of a certain length.
    */
   bson_utf8_from_unichar (0x0000007F, str, &len);
   BSON_ASSERT (len == 1);
   bson_utf8_from_unichar (0x000007FF, str, &len);
   BSON_ASSERT (len == 2);
   bson_utf8_from_unichar (0x0000FFFF, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x001FFFFF, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x03FFFFFF, str, &len);
   BSON_ASSERT (len == 5);
   bson_utf8_from_unichar (0x7FFFFFFF, str, &len);
   BSON_ASSERT (len == 6);

   /*
    * Other interesting values.
    */
   bson_utf8_from_unichar (0x0000D7FF, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0000E000, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0000FFFD, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0010FFFF, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x00110000, str, &len);
   BSON_ASSERT (len == 4);

   bson_utf8_from_unichar ('a', str, &len);
   BSON_ASSERT (len == 1);
   BSON_ASSERT (!memcmp (test1, str, 1));

   bson_utf8_from_unichar (0xFF, str, &len);
   BSON_ASSERT (len == 2);
   BSON_ASSERT (!memcmp ((const char *) test2, str, 2));

   bson_utf8_from_unichar (0x20AC, str, &len);
   BSON_ASSERT (len == 3);
   BSON_ASSERT (!memcmp ((const char *) test3, str, 3));
}